

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createLvalueSwizzle
          (Builder *this,Id typeId,Id target,Id source,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *channels)

{
  bool bVar1;
  uint uVar2;
  Id IVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  int local_58;
  int local_54;
  int i_2;
  int i_1;
  int i;
  int numTargetComponents;
  uint components [4];
  Instruction *swizzle;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *channels_local;
  Id source_local;
  Id target_local;
  Id typeId_local;
  Builder *this_local;
  
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(channels);
  if ((sVar5 == 1) && (uVar2 = getNumComponents(this,source), uVar2 == 1)) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(channels);
    IVar3 = createCompositeInsert(this,source,target,typeId,*pvVar6);
    return IVar3;
  }
  this_00 = (Instruction *)::operator_new(0x60);
  IVar3 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar3,typeId,OpVectorShuffle);
  components._8_8_ = this_00;
  bVar1 = isVector(this,target);
  if (!bVar1) {
    __assert_fail("isVector(target)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbc2,
                  "Id spv::Builder::createLvalueSwizzle(Id, Id, Id, const std::vector<unsigned int> &)"
                 );
  }
  spv::Instruction::reserveOperands((Instruction *)components._8_8_,2);
  spv::Instruction::addIdOperand((Instruction *)components._8_8_,target);
  uVar2 = getNumComponents(this,source);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(channels);
  if (uVar2 == sVar5) {
    bVar1 = isVector(this,source);
    if (bVar1) {
      spv::Instruction::addIdOperand((Instruction *)components._8_8_,source);
      i_1 = getNumComponents(this,target);
      for (i_2 = 0; i_2 < i_1; i_2 = i_2 + 1) {
        (&i)[i_2] = i_2;
      }
      for (local_54 = 0; iVar4 = local_54,
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(channels),
          iVar4 < (int)sVar5; local_54 = local_54 + 1) {
        iVar4 = i_1 + local_54;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (channels,(long)local_54);
        (&i)[*pvVar6] = iVar4;
      }
      spv::Instruction::reserveOperands((Instruction *)components._8_8_,(long)i_1);
      for (local_58 = 0; local_58 < i_1; local_58 = local_58 + 1) {
        spv::Instruction::addImmediateOperand((Instruction *)components._8_8_,(&i)[local_58]);
      }
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_60,
                 (pointer)components._8_8_);
      addInstruction(this,&local_60);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_60);
      IVar3 = spv::Instruction::getResultId((Instruction *)components._8_8_);
      return IVar3;
    }
    __assert_fail("isVector(source)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xbc7,
                  "Id spv::Builder::createLvalueSwizzle(Id, Id, Id, const std::vector<unsigned int> &)"
                 );
  }
  __assert_fail("getNumComponents(source) == channels.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0xbc6,
                "Id spv::Builder::createLvalueSwizzle(Id, Id, Id, const std::vector<unsigned int> &)"
               );
}

Assistant:

Id Builder::createLvalueSwizzle(Id typeId, Id target, Id source, const std::vector<unsigned>& channels)
{
    if (channels.size() == 1 && getNumComponents(source) == 1)
        return createCompositeInsert(source, target, typeId, channels.front());

    Instruction* swizzle = new Instruction(getUniqueId(), typeId, OpVectorShuffle);

    assert(isVector(target));
    swizzle->reserveOperands(2);
    swizzle->addIdOperand(target);

    assert(getNumComponents(source) == channels.size());
    assert(isVector(source));
    swizzle->addIdOperand(source);

    // Set up an identity shuffle from the base value to the result value
    unsigned int components[4];
    int numTargetComponents = getNumComponents(target);
    for (int i = 0; i < numTargetComponents; ++i)
        components[i] = i;

    // Punch in the l-value swizzle
    for (int i = 0; i < (int)channels.size(); ++i)
        components[channels[i]] = numTargetComponents + i;

    // finish the instruction with these components selectors
    swizzle->reserveOperands(numTargetComponents);
    for (int i = 0; i < numTargetComponents; ++i)
        swizzle->addImmediateOperand(components[i]);
    addInstruction(std::unique_ptr<Instruction>(swizzle));

    return swizzle->getResultId();
}